

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool test10(void)

{
  bool bVar1;
  bool local_82;
  int local_80;
  int local_7c;
  int i_4;
  int i_3;
  int c;
  int i_2;
  int local_68;
  int i_1;
  int local_60;
  int i;
  int same;
  int f2;
  int f1;
  undefined1 local_48 [8];
  queue<int> b;
  queue<int> a;
  
  srand(0);
  CP::queue<int>::queue((queue<int> *)&b.mFront);
  CP::queue<int>::queue((queue<int> *)local_48);
  same = 200;
  i = 10;
  local_60 = 9000;
  for (i_1 = 0; i_1 < same; i_1 = i_1 + 1) {
    local_68 = rand();
    CP::queue<int>::push((queue<int> *)&b.mFront,&local_68);
  }
  for (i_2 = 0; i_2 < i; i_2 = i_2 + 1) {
    c = rand();
    CP::queue<int>::push((queue<int> *)local_48,&c);
  }
  for (i_3 = 0; i_3 < local_60; i_3 = i_3 + 1) {
    i_4 = rand();
    CP::queue<int>::push((queue<int> *)&b.mFront,&i_4);
    CP::queue<int>::push((queue<int> *)local_48,&i_4);
  }
  for (local_7c = 0; local_7c < same; local_7c = local_7c + 1) {
    CP::queue<int>::pop((queue<int> *)&b.mFront);
  }
  for (local_80 = 0; local_80 < i; local_80 = local_80 + 1) {
    CP::queue<int>::pop((queue<int> *)local_48);
  }
  bVar1 = CP::queue<int>::operator==((queue<int> *)&b.mFront,(queue<int> *)local_48);
  local_82 = false;
  if (bVar1) {
    local_82 = CP::queue<int>::operator==((queue<int> *)local_48,(queue<int> *)&b.mFront);
  }
  CP::queue<int>::~queue((queue<int> *)local_48);
  CP::queue<int>::~queue((queue<int> *)&b.mFront);
  return local_82;
}

Assistant:

bool test10() {
  srand(0);
  CP::queue<int> a,b;
  int f1 = 200;
  int f2 = 10;
  int same = 9000;
  for (int i = 0;i < f1;i++) a.push(rand());
  for (int i = 0;i < f2;i++) b.push(rand());
  for (int i = 0;i < same;i++) {
    int c = rand();
    a.push(c);
    b.push(c);
  }
  for (int i = 0;i < f1;i++) a.pop();
  for (int i = 0;i < f2;i++) b.pop();
  return ( ((a == b))  && ((b == a)));
}